

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u32_sse_harley_seal_improved(uint32_t *array,size_t len,uint32_t *flags)

{
  size_t i;
  ulong uVar1;
  int j;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 local_f8 [7] [16];
  uint32_t buffer [4];
  
  uVar1 = len & 0xffffffffffffffc0;
  if (uVar1 != len) {
    do {
      lVar2 = 0;
      do {
        flags[lVar2] = flags[lVar2] + (uint)((array[uVar1] >> ((uint)lVar2 & 0x1f) & 1) != 0);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
      uVar1 = uVar1 + 1;
    } while (uVar1 < len);
  }
  uVar1 = len >> 2 & 0x3ffffffffffffff0;
  if (uVar1 == 0) {
    auVar11 = (undefined1  [16])0x0;
    auVar13 = (undefined1  [16])0x0;
    auVar15 = (undefined1  [16])0x0;
    auVar14 = (undefined1  [16])0x0;
  }
  else {
    auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(flags + 0x10));
    auVar46 = ZEXT1664((undefined1  [16])0x0);
    uVar3 = 0;
    auVar40[8] = 0x55;
    auVar40._0_8_ = 0x5555555555555555;
    auVar40[9] = 0x55;
    auVar40[10] = 0x55;
    auVar40[0xb] = 0x55;
    auVar40[0xc] = 0x55;
    auVar40[0xd] = 0x55;
    auVar40[0xe] = 0x55;
    auVar40[0xf] = 0x55;
    auVar41[8] = 1;
    auVar41._0_8_ = 0x101010101010101;
    auVar41[9] = 1;
    auVar41[10] = 1;
    auVar41[0xb] = 1;
    auVar41[0xc] = 1;
    auVar41[0xd] = 1;
    auVar41[0xe] = 1;
    auVar41[0xf] = 1;
    auVar42._8_2_ = 0x3333;
    auVar42._0_8_ = 0x3333333333333333;
    auVar42._10_2_ = 0x3333;
    auVar42._12_2_ = 0x3333;
    auVar42._14_2_ = 0x3333;
    auVar44._8_2_ = 1;
    auVar44._0_8_ = 0x1000100010001;
    auVar44._10_2_ = 1;
    auVar44._12_2_ = 1;
    auVar44._14_2_ = 1;
    auVar45._8_4_ = 0xf;
    auVar45._0_8_ = 0xf0000000f;
    auVar45._12_4_ = 0xf;
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    auVar43 = ZEXT1664((undefined1  [16])0x0);
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    do {
      uVar5 = uVar3 + 0xffff;
      if (uVar1 - uVar3 < 0x10000) {
        uVar5 = uVar1;
      }
      auVar10 = in_ZMM20._0_16_;
      auVar11 = in_ZMM16._0_16_;
      auVar13 = in_ZMM17._0_16_;
      auVar14 = in_ZMM18._0_16_;
      auVar12 = in_ZMM21._0_16_;
      auVar15 = in_ZMM19._0_16_;
      if (uVar3 < uVar5) {
        pauVar6 = (undefined1 (*) [16])(array + uVar3 * 4 + 0x3c);
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar7 = vpxord_avx512vl(auVar10,auVar10);
        auVar8 = vpxord_avx512vl(auVar11,auVar11);
        auVar9 = vpxord_avx512vl(auVar13,auVar13);
        auVar10 = vpxord_avx512vl(auVar14,auVar14);
        auVar11 = vpxord_avx512vl(auVar12,auVar12);
        auVar12 = vpxord_avx512vl(auVar15,auVar15);
        do {
          auVar13 = vmovdqu64_avx512vl(pauVar6[-0xf]);
          auVar14 = vmovdqu64_avx512vl(pauVar6[-0xe]);
          auVar15 = vmovdqu64_avx512vl(pauVar6[-0xd]);
          auVar16 = vmovdqu64_avx512vl(pauVar6[-0xc]);
          auVar17 = vpxorq_avx512vl(auVar13,auVar46._0_16_);
          auVar18 = vpandq_avx512vl(auVar17,auVar14);
          auVar13 = vpternlogq_avx512vl(auVar18,auVar13,auVar46._0_16_,0xf8);
          auVar14 = vpxorq_avx512vl(auVar17,auVar14);
          auVar17 = vpxorq_avx512vl(auVar14,auVar15);
          auVar18 = vpandq_avx512vl(auVar17,auVar16);
          auVar14 = vpternlogq_avx512vl(auVar18,auVar14,auVar15,0xf8);
          auVar15 = vpxorq_avx512vl(auVar17,auVar16);
          auVar16 = vpxorq_avx512vl(auVar13,auVar47._0_16_);
          auVar17 = vpandq_avx512vl(auVar14,auVar16);
          auVar13 = vpternlogq_avx512vl(auVar17,auVar13,auVar47._0_16_,0xf8);
          auVar14 = vpxorq_avx512vl(auVar14,auVar16);
          auVar16 = vmovdqu64_avx512vl(pauVar6[-0xb]);
          auVar17 = vmovdqu64_avx512vl(pauVar6[-10]);
          auVar18 = vpxorq_avx512vl(auVar15,auVar16);
          auVar19 = vpandq_avx512vl(auVar18,auVar17);
          auVar15 = vpternlogq_avx512vl(auVar19,auVar15,auVar16,0xf8);
          auVar16 = vpxorq_avx512vl(auVar18,auVar17);
          auVar17 = vmovdqu64_avx512vl(pauVar6[-9]);
          auVar18 = vmovdqu64_avx512vl(pauVar6[-8]);
          auVar19 = vpxorq_avx512vl(auVar16,auVar17);
          auVar20 = vpandq_avx512vl(auVar19,auVar18);
          auVar16 = vpternlogq_avx512vl(auVar20,auVar16,auVar17,0xf8);
          auVar17 = vpxorq_avx512vl(auVar19,auVar18);
          auVar18 = vpxorq_avx512vl(auVar15,auVar14);
          auVar19 = vpandq_avx512vl(auVar16,auVar18);
          auVar14 = vpternlogq_avx512vl(auVar19,auVar15,auVar14,0xf8);
          auVar15 = vpxorq_avx512vl(auVar16,auVar18);
          auVar16 = vpxorq_avx512vl(auVar13,auVar43._0_16_);
          auVar18 = vpandq_avx512vl(auVar14,auVar16);
          auVar18 = vpternlogq_avx512vl(auVar18,auVar13,auVar43._0_16_,0xf8);
          auVar13 = vpxorq_avx512vl(auVar14,auVar16);
          auVar14 = vmovdqu64_avx512vl(pauVar6[-7]);
          auVar16 = vmovdqu64_avx512vl(pauVar6[-6]);
          auVar19 = vpxorq_avx512vl(auVar17,auVar14);
          auVar20 = vpandq_avx512vl(auVar19,auVar16);
          auVar14 = vpternlogq_avx512vl(auVar20,auVar17,auVar14,0xf8);
          auVar16 = vpxorq_avx512vl(auVar19,auVar16);
          auVar17 = vmovdqu64_avx512vl(pauVar6[-5]);
          auVar19 = vmovdqu64_avx512vl(pauVar6[-4]);
          auVar20 = vpxorq_avx512vl(auVar16,auVar17);
          auVar21 = vpandq_avx512vl(auVar20,auVar19);
          auVar16 = vpternlogq_avx512vl(auVar21,auVar16,auVar17,0xf8);
          auVar17 = vpxorq_avx512vl(auVar20,auVar19);
          auVar19 = vpxorq_avx512vl(auVar14,auVar15);
          auVar20 = vpandq_avx512vl(auVar16,auVar19);
          auVar14 = vpternlogq_avx512vl(auVar20,auVar14,auVar15,0xf8);
          auVar15 = vpxorq_avx512vl(auVar16,auVar19);
          auVar16 = vmovdqu64_avx512vl(pauVar6[-3]);
          auVar19 = vmovdqu64_avx512vl(pauVar6[-2]);
          auVar20 = vpxorq_avx512vl(auVar17,auVar16);
          auVar21 = vpandq_avx512vl(auVar20,auVar19);
          auVar16 = vpternlogq_avx512vl(auVar21,auVar17,auVar16,0xf8);
          auVar17 = vpxorq_avx512vl(auVar20,auVar19);
          auVar19 = vmovdqu64_avx512vl(pauVar6[-1]);
          auVar20 = vmovdqu64_avx512vl(*pauVar6);
          auVar21 = vpxorq_avx512vl(auVar17,auVar19);
          auVar22 = vpandq_avx512vl(auVar21,auVar20);
          auVar17 = vpternlogq_avx512vl(auVar22,auVar17,auVar19,0xf8);
          auVar19 = vpxorq_avx512vl(auVar21,auVar20);
          auVar46 = ZEXT1664(auVar19);
          auVar19 = vpxorq_avx512vl(auVar16,auVar15);
          auVar20 = vpandq_avx512vl(auVar17,auVar19);
          auVar15 = vpternlogq_avx512vl(auVar20,auVar16,auVar15,0xf8);
          auVar16 = vpxorq_avx512vl(auVar17,auVar19);
          auVar47 = ZEXT1664(auVar16);
          auVar16 = vpxorq_avx512vl(auVar14,auVar13);
          auVar17 = vpandq_avx512vl(auVar15,auVar16);
          auVar14 = vpternlogq_avx512vl(auVar17,auVar14,auVar13,0xf8);
          auVar13 = vpxorq_avx512vl(auVar15,auVar16);
          auVar43 = ZEXT1664(auVar13);
          auVar13 = vpshufb_avx(auVar48._0_16_,_DAT_0011f1d0);
          auVar15 = vpsrld_avx512vl(auVar13,1);
          auVar13 = vpand_avx(auVar13,auVar40);
          auVar13 = vpmaddubsw_avx(auVar13,auVar41);
          auVar15 = vpandq_avx512vl(auVar15,auVar40);
          auVar15 = vpmaddubsw_avx512vl(auVar15,auVar41);
          auVar15 = vpslld_avx512vl(auVar15,8);
          auVar13 = vporq_avx512vl(auVar15,auVar13);
          auVar15 = vpsrld_avx512vl(auVar13,2);
          auVar13 = vpand_avx(auVar13,auVar42);
          auVar13 = vpmaddwd_avx(auVar13,auVar44);
          auVar15 = vpandq_avx512vl(auVar15,auVar42);
          auVar15 = vpmaddwd_avx512vl(auVar15,auVar44);
          auVar16 = vpandd_avx512vl(auVar13,auVar45);
          auVar12 = vpaddd_avx512vl(auVar12,auVar16);
          auVar16 = vpsrld_avx512vl(auVar13,4);
          auVar16 = vpandd_avx512vl(auVar16,auVar45);
          auVar11 = vpaddd_avx512vl(auVar11,auVar16);
          auVar16 = vpsrld_avx512vl(auVar13,8);
          auVar16 = vpandd_avx512vl(auVar16,auVar45);
          auVar10 = vpaddd_avx512vl(auVar10,auVar16);
          auVar13 = vpsrld_avx(auVar13,0xc);
          auVar9 = vpaddd_avx512vl(auVar9,auVar13);
          auVar13 = vpandd_avx512vl(auVar15,auVar45);
          auVar8 = vpaddd_avx512vl(auVar8,auVar13);
          auVar13 = vpsrld_avx512vl(auVar15,4);
          auVar13 = vpand_avx(auVar13,auVar45);
          auVar7 = vpaddd_avx512vl(auVar7,auVar13);
          auVar13 = vpsrld_avx512vl(auVar15,8);
          auVar13 = vpand_avx(auVar13,auVar45);
          auVar16 = vpaddd_avx(auVar50._0_16_,auVar13);
          auVar50 = ZEXT1664(auVar16);
          auVar13 = vpsrld_avx512vl(auVar15,0xc);
          auVar17 = vpaddd_avx(auVar49._0_16_,auVar13);
          auVar49 = ZEXT1664(auVar17);
          auVar13 = vpxorq_avx512vl(auVar18,auVar39._0_16_);
          auVar15 = vpandq_avx512vl(auVar14,auVar13);
          auVar15 = vpternlogq_avx512vl(auVar15,auVar18,auVar39._0_16_,0xf8);
          auVar48 = ZEXT1664(auVar15);
          auVar13 = vpxorq_avx512vl(auVar14,auVar13);
          auVar39 = ZEXT1664(auVar13);
          uVar3 = uVar3 + 0x10;
          pauVar6 = pauVar6 + 0x10;
        } while (uVar3 < uVar5);
        auVar18 = vpslld_avx512vl(auVar11,4);
        auVar7 = vpslld_avx512vl(auVar7,4);
        auVar23 = vmovdqa64_avx512f(auVar23);
      }
      else {
        auVar17 = (undefined1  [16])0x0;
        auVar16 = (undefined1  [16])0x0;
        auVar7 = vpxord_avx512vl(auVar10,auVar10);
        auVar8 = vpxord_avx512vl(auVar11,auVar11);
        auVar9 = vpxord_avx512vl(auVar13,auVar13);
        auVar10 = vpxord_avx512vl(auVar14,auVar14);
        auVar18 = vpxord_avx512vl(auVar12,auVar12);
        auVar12 = vpxord_avx512vl(auVar15,auVar15);
        auVar23 = vmovdqa64_avx512f(auVar23);
      }
      auVar11 = auVar39._0_16_;
      auVar13 = auVar43._0_16_;
      auVar15 = auVar47._0_16_;
      auVar14 = auVar46._0_16_;
      auVar19 = vpshufb_avx512vl(auVar48._0_16_,_DAT_0011f1d0);
      auVar20 = vpsrld_avx512vl(auVar19,1);
      auVar19 = vpandq_avx512vl(auVar19,auVar40);
      auVar19 = vpmaddubsw_avx512vl(auVar19,auVar41);
      auVar20 = vpandq_avx512vl(auVar20,auVar40);
      auVar20 = vpmaddubsw_avx512vl(auVar20,auVar41);
      auVar20 = vpslld_avx512vl(auVar20,8);
      auVar19 = vporq_avx512vl(auVar20,auVar19);
      auVar20 = vpsrld_avx512vl(auVar19,2);
      auVar19 = vpandq_avx512vl(auVar19,auVar42);
      auVar19 = vpmaddwd_avx512vl(auVar19,auVar44);
      auVar20 = vpandq_avx512vl(auVar20,auVar42);
      auVar20 = vpmaddwd_avx512vl(auVar20,auVar44);
      auVar21 = vpandd_avx512vl(auVar19,auVar45);
      auVar12 = vpaddd_avx512vl(auVar12,auVar21);
      auVar21 = vpsrld_avx512vl(auVar19,8);
      auVar21 = vpandd_avx512vl(auVar21,auVar45);
      auVar21 = vpaddd_avx512vl(auVar10,auVar21);
      auVar10 = vpsrld_avx512vl(auVar19,0xc);
      auVar9 = vpaddd_avx512vl(auVar9,auVar10);
      auVar10 = vpandd_avx512vl(auVar20,auVar45);
      auVar8 = vpaddd_avx512vl(auVar8,auVar10);
      auVar10 = vpsrld_avx512vl(auVar20,8);
      auVar10 = vpandd_avx512vl(auVar10,auVar45);
      auVar16 = vpaddd_avx512vl(auVar16,auVar10);
      auVar10 = vpsrld_avx512vl(auVar20,0xc);
      auVar17 = vpaddd_avx512vl(auVar17,auVar10);
      auVar12 = vpslld_avx512vl(auVar12,4);
      auVar10 = vmovdqa64_avx512vl(auVar12);
      auVar22._8_4_ = 0xf0;
      auVar22._0_8_ = 0xf0000000f0;
      auVar22._12_4_ = 0xf0;
      auVar19 = vpandd_avx512vl(auVar19,auVar22);
      auVar18 = vpaddd_avx512vl(auVar19,auVar18);
      auVar19 = vpslld_avx512vl(auVar21,4);
      auVar9 = vpslld_avx512vl(auVar9,4);
      auVar8 = vpslld_avx512vl(auVar8,4);
      auVar20 = vpandd_avx512vl(auVar20,auVar22);
      auVar7 = vpaddd_avx512vl(auVar20,auVar7);
      auVar20 = vpslld_avx512vl(auVar16,4);
      auVar17 = vpslld_avx512vl(auVar17,4);
      auVar16 = vpshufd_avx512vl(auVar12,0xee);
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar49 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar50 = vbroadcastss_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar18);
      local_f8[0]._0_4_ = auVar10._0_4_;
      in_ZMM21 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._0_4_));
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar25 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar26 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._8_4_));
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar27 = vbroadcastss_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar19);
      local_f8[0]._0_4_ = auVar10._0_4_;
      auVar12 = vpinsrd_avx512dq(auVar12,local_f8[0]._0_4_,1);
      local_f8[0]._4_4_ = auVar10._4_4_;
      in_ZMM19 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar16 = vpinsrd_avx512dq(auVar16,local_f8[0]._8_4_,1);
      local_f8[0]._12_4_ = auVar10._12_4_;
      in_ZMM17 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar9);
      local_f8[0]._0_4_ = auVar10._0_4_;
      auVar28 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._0_4_));
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar29 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar30 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._8_4_));
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar31 = vbroadcastss_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar8);
      local_f8[0]._0_4_ = auVar10._0_4_;
      auVar12 = vpinsrd_avx512dq(auVar12,local_f8[0]._0_4_,2);
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar32 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar16 = vpinsrd_avx512dq(auVar16,local_f8[0]._8_4_,2);
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar33 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar7);
      local_f8[0]._0_4_ = auVar10._0_4_;
      in_ZMM20 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._0_4_));
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar34 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar35 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._8_4_));
      local_f8[0]._12_4_ = auVar10._12_4_;
      in_ZMM16 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar20);
      local_f8[0]._0_4_ = auVar10._0_4_;
      auVar12 = vpinsrd_avx512dq(auVar12,local_f8[0]._0_4_,3);
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar36 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar16 = vpinsrd_avx512dq(auVar16,local_f8[0]._8_4_,3);
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar37 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar10 = vmovdqa64_avx512vl(auVar17);
      auVar38 = vmovdqa32_avx512f(in_ZMM21);
      in_ZMM18._16_4_ = auVar38._16_4_;
      auVar28 = vmovdqa32_avx512f(auVar28);
      in_ZMM18._20_4_ = auVar28._20_4_;
      auVar28 = vmovdqa32_avx512f(in_ZMM20);
      in_ZMM18._24_4_ = auVar28._24_4_;
      local_f8[0]._0_4_ = auVar10._0_4_;
      auVar28 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._0_4_));
      in_ZMM18._28_4_ = auVar28._28_4_;
      auVar49 = vmovdqa32_avx512f(auVar49);
      in_ZMM18._32_4_ = auVar49._32_4_;
      auVar49 = vmovdqa32_avx512f(in_ZMM19);
      in_ZMM18._36_4_ = auVar49._36_4_;
      auVar49 = vmovdqa32_avx512f(auVar32);
      in_ZMM18._40_4_ = auVar49._40_4_;
      auVar49 = vmovdqa32_avx512f(auVar36);
      in_ZMM18._44_4_ = auVar49._44_4_;
      auVar49 = vmovdqa32_avx512f(auVar25);
      in_ZMM18._48_4_ = auVar49._48_4_;
      auVar49 = vmovdqa32_avx512f(auVar29);
      in_ZMM18._52_4_ = auVar49._52_4_;
      auVar49 = vmovdqa32_avx512f(auVar34);
      in_ZMM18._56_4_ = auVar49._56_4_;
      local_f8[0]._4_4_ = auVar10._4_4_;
      auVar49 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._4_4_));
      in_ZMM18._0_16_ = auVar12;
      in_ZMM18._60_4_ = auVar49._60_4_;
      auVar49 = vpaddd_avx512f(auVar23,in_ZMM18);
      auVar23 = vmovdqa32_avx512f(auVar26);
      auVar25._16_4_ = auVar23._16_4_;
      auVar23 = vmovdqa32_avx512f(auVar30);
      auVar25._20_4_ = auVar23._20_4_;
      auVar23 = vmovdqa32_avx512f(auVar35);
      auVar25._24_4_ = auVar23._24_4_;
      auVar23 = vmovdqu64_avx512f(auVar49);
      *(undefined1 (*) [64])flags = auVar23;
      local_f8[0]._8_4_ = auVar10._8_4_;
      auVar23 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._8_4_));
      auVar25._28_4_ = auVar23._28_4_;
      auVar23 = vmovdqu64_avx512f(auVar50);
      auVar23 = vmovdqa32_avx512f(auVar23);
      auVar25._32_4_ = auVar23._32_4_;
      auVar23 = vmovdqa32_avx512f(in_ZMM17);
      auVar25._36_4_ = auVar23._36_4_;
      auVar23 = vmovdqa32_avx512f(auVar33);
      auVar25._40_4_ = auVar23._40_4_;
      auVar23 = vmovdqa32_avx512f(auVar37);
      auVar25._44_4_ = auVar23._44_4_;
      auVar23 = vmovdqu64_avx512f(auVar27);
      auVar23 = vmovdqa32_avx512f(auVar23);
      auVar25._48_4_ = auVar23._48_4_;
      auVar23 = vmovdqu64_avx512f(auVar31);
      auVar23 = vmovdqa32_avx512f(auVar23);
      auVar25._52_4_ = auVar23._52_4_;
      auVar23 = vmovdqa32_avx512f(in_ZMM16);
      auVar25._56_4_ = auVar23._56_4_;
      local_f8[0]._12_4_ = auVar10._12_4_;
      auVar23 = vpbroadcastd_avx512f(ZEXT416((uint)local_f8[0]._12_4_));
      auVar25._0_16_ = auVar16;
      auVar25._60_4_ = auVar23._60_4_;
      auVar24 = vpaddd_avx512f(auVar24,auVar25);
      auVar23 = vmovdqu64_avx512f(auVar24);
      *(undefined1 (*) [64])(flags + 0x10) = auVar23;
      auVar23 = vmovdqa64_avx512f(auVar49);
    } while (uVar3 < uVar1);
  }
  local_f8[0] = auVar14;
  lVar2 = 0;
  auVar23 = vpmovsxbd_avx512f(_DAT_0011f080);
  auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar39 = vpbroadcastd_avx512f(ZEXT416(0x10));
  do {
    auVar43 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_f8[0] + lVar2 * 4)));
    lVar4 = 0;
    auVar46 = vmovdqa64_avx512f(auVar23);
    do {
      auVar47 = vpsrlvd_avx512f(auVar43,auVar46);
      auVar47 = vpandd_avx512f(auVar47,auVar24);
      auVar47 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])(flags + lVar4));
      auVar47 = vmovdqu64_avx512f(auVar47);
      *(undefined1 (*) [64])(flags + lVar4) = auVar47;
      lVar4 = lVar4 + 0x10;
      auVar46 = vpaddd_avx512f(auVar46,auVar39);
    } while (lVar4 != 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_f8[0] = auVar15;
  lVar2 = 0;
  auVar23 = vpmovsxbd_avx512f(_DAT_0011f080);
  auVar24 = vpbroadcastd_avx512f(ZEXT416(2));
  do {
    auVar43 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_f8[0] + lVar2 * 4)));
    lVar4 = 0;
    auVar46 = vmovdqa64_avx512f(auVar23);
    do {
      auVar47 = vpsrlvd_avx512f(auVar43,auVar46);
      auVar47 = vpaddd_avx512f(auVar47,auVar47);
      auVar47 = vpandd_avx512f(auVar47,auVar24);
      auVar47 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])(flags + lVar4));
      auVar47 = vmovdqu64_avx512f(auVar47);
      *(undefined1 (*) [64])(flags + lVar4) = auVar47;
      lVar4 = lVar4 + 0x10;
      auVar46 = vpaddd_avx512f(auVar46,auVar39);
    } while (lVar4 != 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_f8[0] = auVar13;
  lVar2 = 0;
  auVar23 = vpmovsxbd_avx512f(_DAT_0011f080);
  auVar24 = vpbroadcastd_avx512f(ZEXT416(4));
  do {
    auVar43 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_f8[0] + lVar2 * 4)));
    lVar4 = 0;
    auVar46 = vmovdqa64_avx512f(auVar23);
    do {
      auVar47 = vpsrlvd_avx512f(auVar43,auVar46);
      auVar47 = vpslld_avx512f(auVar47,2);
      auVar47 = vpandd_avx512f(auVar47,auVar24);
      auVar47 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])(flags + lVar4));
      auVar47 = vmovdqu64_avx512f(auVar47);
      *(undefined1 (*) [64])(flags + lVar4) = auVar47;
      lVar4 = lVar4 + 0x10;
      auVar46 = vpaddd_avx512f(auVar46,auVar39);
    } while (lVar4 != 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_f8[0] = auVar11;
  lVar2 = 0;
  auVar23 = vpmovsxbd_avx512f(_DAT_0011f080);
  auVar24 = vpbroadcastd_avx512f(ZEXT416(8));
  do {
    auVar43 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_f8[0] + lVar2 * 4)));
    lVar4 = 0;
    auVar46 = vmovdqa64_avx512f(auVar23);
    do {
      auVar47 = vpsrlvd_avx512f(auVar43,auVar46);
      auVar47 = vpslld_avx512f(auVar47,3);
      auVar47 = vpandd_avx512f(auVar47,auVar24);
      auVar47 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])(flags + lVar4));
      auVar47 = vmovdqu64_avx512f(auVar47);
      *(undefined1 (*) [64])(flags + lVar4) = auVar47;
      lVar4 = lVar4 + 0x10;
      auVar46 = vpaddd_avx512f(auVar46,auVar39);
    } while (lVar4 != 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void pospopcnt_u32_sse_harley_seal_improved(const uint32_t* array, size_t len, uint32_t* flags) {
    for (size_t i = len - (len % (16 * 4)); i < len; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 4;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint32_t buffer[4];
    __m128i counter[8];

    const __m128i lookup = _mm_setr_epi8( 0,  4,  8, 12,
                                          1,  5,  9, 13,
                                          2,  6, 10, 14,
                                          3,  7, 11, 15);

    while (i < limit) {
        for (size_t i = 0; i < 8; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);

            {
                const __m128i t0 = _mm_shuffle_epi8(v16, lookup);
                const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
                const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

                const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
                const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

                const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

                const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
                const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

                const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
                const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

                const __m128i mask = _mm_set1_epi32(0x0000000f);
                counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
                counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
                counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
                counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
                counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
                counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
                counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
                counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));
            }

            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
        }

        // update the counters after the last iteration
        {
            const __m128i t0 = _mm_shuffle_epi8(v16, lookup);

            const __m128i m0 = _mm_and_si128(t0, _mm_set1_epi8(0x55));
            const __m128i m1 = _mm_and_si128(_mm_srli_epi32(t0, 1), _mm_set1_epi8(0x55));

            const __m128i s0 = _mm_maddubs_epi16(m0, _mm_set1_epi16(0x0101));
            const __m128i s1 = _mm_maddubs_epi16(m1, _mm_set1_epi16(0x0101));

            const __m128i t1 = _mm_or_si128(s0, _mm_slli_epi32(s1, 8));

            const __m128i n0 = _mm_and_si128(t1, _mm_set1_epi8(0x33));
            const __m128i n1 = _mm_and_si128(_mm_srli_epi32(t1, 2), _mm_set1_epi8(0x33));

            const __m128i S0 = _mm_madd_epi16(n0, _mm_set1_epi32(0x00010001));
            const __m128i S1 = _mm_madd_epi16(n1, _mm_set1_epi32(0x00010001));

            const __m128i mask = _mm_set1_epi32(0x0000000f);
            counter[0] = _mm_add_epi32(counter[0], _mm_and_si128(S0, mask));
            counter[1] = _mm_add_epi32(counter[1], _mm_and_si128(_mm_srli_epi32(S0,  4), mask));
            counter[2] = _mm_add_epi32(counter[2], _mm_and_si128(_mm_srli_epi32(S0,  8), mask));
            counter[3] = _mm_add_epi32(counter[3], _mm_and_si128(_mm_srli_epi32(S0, 12), mask));
            counter[4] = _mm_add_epi32(counter[4], _mm_and_si128(S1, mask));
            counter[5] = _mm_add_epi32(counter[5], _mm_and_si128(_mm_srli_epi32(S1,  4), mask));
            counter[6] = _mm_add_epi32(counter[6], _mm_and_si128(_mm_srli_epi32(S1,  8), mask));
            counter[7] = _mm_add_epi32(counter[7], _mm_and_si128(_mm_srli_epi32(S1, 12), mask));

#define update_flags(counterN, index0, index1, index2, index3)      \
            _mm_storeu_si128((__m128i*)buffer, _mm_slli_epi32(counterN, 4));           \
            flags[index0] += buffer[0]; flags[index1] += buffer[1]; \
            flags[index2] += buffer[2]; flags[index3] += buffer[3];

            update_flags(counter[0], 0,  8, 16, 24);
            update_flags(counter[1], 4, 12, 20, 28);
            update_flags(counter[2], 1,  9, 17, 25);
            update_flags(counter[3], 5, 13, 21, 29);
            update_flags(counter[4], 2, 10, 18, 26);
            update_flags(counter[5], 6, 14, 22, 30);
            update_flags(counter[6], 3, 11, 19, 27);
            update_flags(counter[7], 7, 15, 23, 31);
#undef update_flags
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 4; ++i) {
        for (int j = 0; j < 32; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
}